

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DestroyContext(ImGuiContext *ctx)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  if (ctx == (ImGuiContext *)0x0) {
    ctx = GImGui;
  }
  GImGui = ctx;
  Shutdown();
  GImGui = (ImGuiContext *)0x0;
  if (pIVar1 != ctx) {
    GImGui = pIVar1;
  }
  IM_DELETE<ImGuiContext>(ctx);
  return;
}

Assistant:

void ImGui::DestroyContext(ImGuiContext* ctx)
{
    ImGuiContext* prev_ctx = GetCurrentContext();
    if (ctx == NULL) //-V1051
        ctx = prev_ctx;
    SetCurrentContext(ctx);
    Shutdown();
    SetCurrentContext((prev_ctx != ctx) ? prev_ctx : NULL);
    IM_DELETE(ctx);
}